

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_create(nng_dialer *dp,nng_socket sid,char *addr)

{
  int iVar1;
  uint32_t uVar2;
  nng_dialer did;
  int rv;
  nni_dialer *d;
  nni_sock *s;
  char *addr_local;
  nng_dialer *dp_local;
  nng_socket sid_local;
  
  s = (nni_sock *)addr;
  addr_local = (char *)dp;
  dp_local._0_4_ = sid.id;
  dp_local._4_4_ = nni_sock_find((nni_sock **)&d,sid.id);
  if (dp_local._4_4_ == 0) {
    iVar1 = nni_dialer_create((nni_dialer **)&did,(nni_sock *)d,(char *)s);
    if (iVar1 == 0) {
      uVar2 = nni_dialer_id(_did);
      *(uint32_t *)addr_local = uVar2;
      nni_dialer_rele(_did);
      dp_local._4_4_ = 0;
    }
    else {
      nni_sock_rele((nni_sock *)d);
      dp_local._4_4_ = iVar1;
    }
  }
  return dp_local._4_4_;
}

Assistant:

int
nng_dialer_create(nng_dialer *dp, nng_socket sid, const char *addr)
{
	nni_sock   *s;
	nni_dialer *d;
	int         rv;
	nng_dialer  did;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_dialer_create(&d, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	did.id = nni_dialer_id(d);
	*dp    = did;
	nni_dialer_rele(d);
	return (0);
}